

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O3

void __thiscall
charls_jpegls_encoder::write_comment(charls_jpegls_encoder *this,const_byte_span comment)

{
  if (comment.data_ == (uint8_t *)0x0) {
LAB_0010642f:
    if (comment.size_ != 0) {
      write_comment();
      goto LAB_00106463;
    }
  }
  else if (0xfffd < comment.size_) {
    write_comment();
    goto LAB_0010642f;
  }
  if (this->state_ - destination_set < 3) {
    transition_to_tables_and_miscellaneous_state(this);
    charls::jpeg_stream_writer::write_comment_segment(&this->writer_,comment);
    return;
  }
LAB_00106463:
  write_comment();
}

Assistant:

void write_comment(const const_byte_span comment)
    {
        check_argument(comment.data() || comment.empty());
        check_argument(comment.size() <= segment_max_data_size, jpegls_errc::invalid_argument_size);
        check_operation(state_ >= state::destination_set && state_ < state::completed);

        transition_to_tables_and_miscellaneous_state();
        writer_.write_comment_segment(comment);
    }